

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildSetupFont
               (ImFontAtlas *atlas,ImFont *font,ImFontConfig *font_config,float ascent,float descent
               )

{
  long in_RDX;
  undefined4 *in_RSI;
  undefined8 in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  
  if ((*(byte *)(in_RDX + 0x48) & 1) == 0) {
    ImFont::ClearOutputData((ImFont *)CONCAT44(in_XMM0_Da,in_XMM1_Da));
    *in_RSI = *(undefined4 *)(in_RDX + 0x14);
    *(long *)(in_RSI + 0x14) = in_RDX;
    *(undefined8 *)(in_RSI + 0x16) = in_RDI;
    in_RSI[0x18] = in_XMM0_Da;
    in_RSI[0x19] = in_XMM1_Da;
  }
  *(short *)((long)in_RSI + 0x4e) = *(short *)((long)in_RSI + 0x4e) + 1;
  return;
}

Assistant:

void ImFontAtlasBuildSetupFont(ImFontAtlas* atlas, ImFont* font, ImFontConfig* font_config, float ascent, float descent)
{
    if (!font_config->MergeMode)
    {
        font->ClearOutputData();
        font->FontSize = font_config->SizePixels;
        font->ConfigData = font_config;
        font->ContainerAtlas = atlas;
        font->Ascent = ascent;
        font->Descent = descent;
    }
    font->ConfigDataCount++;
}